

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gate.c
# Opt level: O1

int gate_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  void *pvVar1;
  float fVar2;
  double dVar3;
  
  pvVar1 = segment->data;
  switch(field) {
  case 0x18:
    fVar2 = *(float *)((long)pvVar1 + 0x14);
    goto LAB_0013e8ed;
  case 0x19:
    fVar2 = *(float *)((long)pvVar1 + 0x10);
LAB_0013e8ed:
    dVar3 = log10((double)fVar2);
    fVar2 = (float)(dVar3 * 20.0);
    break;
  case 0x1a:
    fVar2 = *(float *)((long)pvVar1 + 0x18);
    break;
  case 0x1b:
    fVar2 = *(float *)((long)pvVar1 + 0x1c);
    break;
  case 0x1c:
    fVar2 = *(float *)((long)pvVar1 + 0x20);
    break;
  default:
    if (field == 1) {
      *(bool *)value = segment->mix == gate_segment_mix_bypass;
      return 1;
    }
    if (field == 2) {
      *(undefined4 *)value = *(undefined4 *)((long)pvVar1 + 0x24);
      return 1;
    }
    mixed_err(7);
    return 0;
  }
  *(float *)value = fVar2;
  return 1;
}

Assistant:

int gate_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct gate_segment_data *data = (struct gate_segment_data *)segment->data;
  switch(field){
  case MIXED_GATE_OPEN_THRESHOLD: *((float *)value) = linear_to_db(data->open_threshold); break;
  case MIXED_GATE_CLOSE_THRESHOLD: *((float *)value) = linear_to_db(data->close_threshold); break;
  case MIXED_GATE_ATTACK: *((float *)value) = data->attack; break;
  case MIXED_GATE_HOLD: *((float *)value) = data->hold; break;
  case MIXED_GATE_RELEASE: *((float *)value) = data->release; break;
  case MIXED_SAMPLERATE: *((uint32_t *)value) = data->samplerate; break;
  case MIXED_BYPASS: *((bool *)value) = (segment->mix == gate_segment_mix_bypass); break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}